

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 soft_float32_to_float64(float32 a,float_status *s)

{
  ulong uVar1;
  uint64_t uVar2;
  float64 fVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  FloatParts FVar7;
  
  FVar7 = float32_unpack_raw(a);
  FVar7 = sf_canonicalize(FVar7,&float32_params,s);
  uVar1 = FVar7.frac;
  if (float_class_inf < FVar7.cls) {
    if (FVar7.cls == float_class_snan) {
      s->float_exception_flags = s->float_exception_flags | 1;
      uVar4 = FVar7._8_8_ & 0xffffff00ffffffff | 0x400000000;
      FVar7.exp = (int)uVar4;
      FVar7.cls = (char)(uVar4 >> 0x20);
      FVar7.sign = (_Bool)(char)(uVar4 >> 0x28);
      FVar7._14_2_ = (short)(uVar4 >> 0x30);
      FVar7.frac = uVar1 | 0x2000000000000000;
    }
    uVar5 = FVar7._8_8_;
    uVar2 = FVar7.frac;
    bVar6 = s->default_nan_mode != '\0';
    if (bVar6) {
      uVar2 = 0x2000000000000000;
    }
    FVar7.exp = (int)uVar5;
    FVar7.cls = (char)((ulong)uVar5 >> 0x20);
    FVar7.sign = (_Bool)(char)((ulong)uVar5 >> 0x28);
    FVar7._14_2_ = (short)((ulong)uVar5 >> 0x30);
    FVar7.frac = uVar2;
    if (bVar6) {
      FVar7.exp = 0x7fffffff;
      FVar7.cls = float_class_qnan;
      FVar7.sign = false;
      FVar7._14_2_ = 0;
    }
  }
  FVar7 = round_canonical(FVar7,s,&float64_params);
  fVar3 = float64_pack_raw(FVar7);
  return fVar3;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_float32_to_float64(float32 a, float_status *s)
{
    FloatParts p = float32_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, &float64_params, s);
    return float64_round_pack_canonical(pr, s);
}